

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

int __thiscall
QtPrivate::QGenericArrayOps<QFileInfo>::truncate
          (QGenericArrayOps<QFileInfo> *this,char *__file,__off_t __length)

{
  QFileInfo *pQVar1;
  QFileInfo *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QFileInfo> *this_00;
  
  pQVar1 = QArrayDataPointer<QFileInfo>::begin((QArrayDataPointer<QFileInfo> *)0x187901);
  this_00 = (QArrayDataPointer<QFileInfo> *)(pQVar1 + (long)__file);
  QArrayDataPointer<QFileInfo>::end(this_00);
  std::destroy<QFileInfo*>((QFileInfo *)this_00,in_stack_ffffffffffffffd8);
  (this->super_QArrayDataPointer<QFileInfo>).size = (qsizetype)__file;
  return (int)this;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }